

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError str2unummax(long *val,char *str,long max)

{
  ParameterError PVar1;
  
  PVar1 = getnum(val,str,10);
  if (PVar1 == PARAM_OK) {
    PVar1 = (ParameterError)(*val >> 0x3f) & PARAM_NEGATIVE_NUMERIC;
  }
  if ((PVar1 == PARAM_OK) && (PVar1 = PARAM_NUMBER_TOO_LARGE, *val <= max)) {
    PVar1 = PARAM_OK;
  }
  return PVar1;
}

Assistant:

ParameterError str2unummax(long *val, const char *str, long max)
{
  ParameterError result = str2unum(val, str);
  if(result != PARAM_OK)
    return result;
  if(*val > max)
    return PARAM_NUMBER_TOO_LARGE;

  return PARAM_OK;
}